

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase::StreamingReporterBase
          (StreamingReporterBase *this,ReporterConfig *_config)

{
  ostream *poVar1;
  ReporterConfig *in_RSI;
  undefined8 *in_RDI;
  ReporterConfig *in_stack_ffffffffffffffb8;
  SharedImpl<Catch::IStreamingReporter> *in_stack_ffffffffffffffc0;
  
  SharedImpl<Catch::IStreamingReporter>::SharedImpl(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__StreamingReporterBase_0021ee50;
  ReporterConfig::fullConfig(in_stack_ffffffffffffffb8);
  Option<Catch::TestRunInfo>::Option((Option<Catch::TestRunInfo> *)(in_RDI + 3));
  Option<Catch::GroupInfo>::Option((Option<Catch::GroupInfo> *)(in_RDI + 8));
  Option<Catch::TestCaseInfo>::Option((Option<Catch::TestCaseInfo> *)(in_RDI + 0xf));
  Ptr<Catch::ThreadedSectionInfo>::Ptr((Ptr<Catch::ThreadedSectionInfo> *)(in_RDI + 0x2c));
  poVar1 = ReporterConfig::stream(in_RSI);
  in_RDI[0x2d] = poVar1;
  std::
  vector<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
  ::vector((vector<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
            *)0x1f3fb8);
  return;
}

Assistant:

StreamingReporterBase( ReporterConfig const& _config )
        :   m_config( _config.fullConfig() ),
            stream( _config.stream() )
        {}